

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceCountQuantity::SurfaceCountQuantity
          (SurfaceCountQuantity *this,string *name,SurfaceMesh *mesh_,string *descriptiveType_)

{
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar1;
  string *in_RCX;
  string *in_RSI;
  SurfaceMesh *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ScaledValue<double> SVar2;
  AffineRemapper<double> *in_stack_fffffffffffffea0;
  size_type *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  string *name_00;
  string *in_stack_fffffffffffffef0;
  PersistentValue<polyscope::ScaledValue<float>_> *in_stack_fffffffffffffef8;
  ScaledValue<float> in_stack_ffffffffffffff00;
  Quantity<polyscope::SurfaceMesh> *in_stack_ffffffffffffff08;
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff10;
  string local_e8 [32];
  string local_c8 [32];
  ScaledValue<double> local_a8;
  ScaledValue<float> local_98;
  string local_90 [32];
  string local_70 [48];
  string local_40 [2];
  
  name_00 = local_40;
  std::__cxx11::string::string((string *)name_00,in_RSI);
  SurfaceMeshQuantity::SurfaceMeshQuantity
            ((SurfaceMeshQuantity *)in_stack_fffffffffffffef0,name_00,in_RDI,
             SUB81((ulong)in_RCX >> 0x38,0));
  std::__cxx11::string::~string((string *)local_40);
  (in_RDI->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure._vptr_Structure =
       (_func_int **)&PTR__SurfaceCountQuantity_00795d10;
  AffineRemapper<double>::AffineRemapper(in_stack_fffffffffffffea0);
  std::
  vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
  ::vector((vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
            *)0x3c6704);
  aVar1 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
          std::numeric_limits<int>::min();
  (in_RDI->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure.objectTransform.value.
  value[2].field_2 = aVar1;
  std::__cxx11::string::string
            ((string *)
             ((in_RDI->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure.
              objectTransform.value.value + 3),in_RCX);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x3c6742);
  Quantity<polyscope::SurfaceMesh>::uniquePrefix_abi_cxx11_(in_stack_ffffffffffffff08);
  std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
  SVar2 = relativeValue<double>(1.95584334428801e-317);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)SVar2.value;
  local_a8.relativeFlag = SVar2.relativeFlag;
  local_a8.value = (double)__lhs;
  ScaledValue<float>::ScaledValue<double>(&local_98,&local_a8);
  PersistentValue<polyscope::ScaledValue<float>_>::PersistentValue
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  __rhs = &(in_RDI->super_QuantityStructure<polyscope::SurfaceMesh>).super_Structure.transformGizmo.
           enabled.name._M_string_length;
  Quantity<polyscope::SurfaceMesh>::uniquePrefix_abi_cxx11_(in_stack_ffffffffffffff08);
  std::operator+(__lhs,(char *)__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffef8,"coolwarm",(allocator *)&stack0xfffffffffffffef7);
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::PersistentValue(in_stack_ffffffffffffff10,(string *)in_stack_ffffffffffffff08,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffff00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  return;
}

Assistant:

SurfaceCountQuantity::SurfaceCountQuantity(std::string name, SurfaceMesh& mesh_, std::string descriptiveType_)
    : SurfaceMeshQuantity(name, mesh_), descriptiveType(descriptiveType_),
      pointRadius(uniquePrefix() + "#pointRadius", relativeValue(0.005)),
      colorMap(uniquePrefix() + "#colorMap", "coolwarm") {}